

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v7::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> local_d8;
  undefined1 auVar35 [16];
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&local_d8,&this->bigits_);
  uVar30 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  if ((int)uVar30 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar34 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  uVar29 = (ulong)(uVar30 * 2);
  if (uVar34 < uVar29) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
    uVar34 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  }
  if (uVar34 < uVar29) {
    uVar29 = uVar34;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar29;
  if (uVar30 == 0) {
    uVar34 = 0;
    uVar29 = 0;
  }
  else {
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar21 = -0xc;
    uVar23 = 0;
    uVar34 = 0;
    uVar29 = 0;
    uVar11 = 4;
    do {
      uVar25 = 0;
      auVar40 = vpbroadcastq_avx512vl();
      lVar8 = 0;
      lVar12 = lVar21;
      uVar5 = 0;
      lVar17 = 0;
      uVar6 = 0;
      lVar28 = 0;
      uVar31 = 0;
      do {
        uVar26 = uVar31;
        uVar22 = uVar29;
        lVar9 = lVar28;
        uVar16 = uVar6;
        lVar13 = lVar17;
        uVar18 = uVar5;
        uVar10 = uVar34;
        lVar20 = lVar8;
        auVar41 = vpbroadcastq_avx512vl();
        auVar41 = vpor_avx2(auVar41,auVar2);
        uVar19 = vpcmpuq_avx512vl(auVar41,auVar40,2);
        uVar33 = uVar19 & 0xf;
        auVar35 = vpmovm2d_avx512vl(uVar33);
        auVar35 = vpshufd_avx(auVar35,0x1b);
        uVar34 = vpmovd2m_avx512vl(auVar35);
        auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                      ((long)local_d8.super_buffer<unsigned_int>.ptr_ + lVar12));
        auVar36._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar35._4_4_;
        auVar36._0_4_ = (uint)((byte)uVar34 & 1) * auVar35._0_4_;
        auVar36._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar35._8_4_;
        auVar36._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar35._12_4_;
        auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                      (local_d8.super_buffer<unsigned_int>.ptr_ + uVar25));
        auVar37._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar35._4_4_;
        auVar37._0_4_ = (uint)((byte)uVar33 & 1) * auVar35._0_4_;
        auVar37._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar35._8_4_;
        auVar37._12_4_ = (uint)(byte)(uVar33 >> 3) * auVar35._12_4_;
        auVar35 = vpshufd_avx(auVar36,0x1b);
        auVar41 = vpmovzxdq_avx2(auVar37);
        auVar3 = vpmovzxdq_avx2(auVar35);
        auVar41 = vpmuludq_avx2(auVar3,auVar41);
        uVar24 = vpextrq_avx(auVar41._0_16_,1);
        uVar15 = vpextrq_avx(auVar41._16_16_,1);
        lVar28 = lVar9 + (ulong)CARRY8(uVar15,uVar18);
        uVar31 = auVar41._16_8_ + uVar26;
        lVar8 = lVar20 + (ulong)CARRY8(auVar41._16_8_,uVar26);
        lVar17 = lVar13 + (ulong)CARRY8(uVar24,uVar16);
        uVar34 = auVar41._0_8_ + uVar10;
        uVar29 = uVar22 + CARRY8(auVar41._0_8_,uVar10);
        uVar25 = uVar25 + 4;
        lVar12 = lVar12 + -0x10;
        uVar5 = uVar15 + uVar18;
        uVar6 = uVar24 + uVar16;
      } while ((uVar11 & 0xfffffffffffffffc) != uVar25);
      bVar4 = (byte)uVar33 >> 2;
      if ((uVar19 & 1) != 0) {
        uVar22 = uVar29;
        uVar10 = uVar34;
      }
      if ((bVar4 & 1) != 0) {
        uVar26 = uVar31;
        lVar20 = lVar8;
      }
      if ((uVar19 & 2) != 0) {
        lVar13 = lVar17;
        uVar16 = uVar24 + uVar16;
      }
      if ((bVar4 & 2) != 0) {
        lVar9 = lVar28;
        uVar18 = uVar15 + uVar18;
      }
      uVar34 = uVar26 + uVar10 + uVar18 + uVar16;
      uVar29 = lVar20 + uVar22 + (ulong)CARRY8(uVar26,uVar10) +
               lVar9 + lVar13 + (ulong)CARRY8(uVar18,uVar16) +
               (ulong)CARRY8(uVar26 + uVar10,uVar18 + uVar16);
      uVar11 = uVar11 + 1;
      lVar21 = lVar21 + 4;
      puVar1[uVar23] = (uint)uVar34;
      uVar34 = uVar34 >> 0x20 | uVar29 << 0x20;
      uVar29 = uVar29 >> 0x20;
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uVar30 & 0x7fffffff));
  }
  if ((int)uVar30 < (int)(uVar30 * 2)) {
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    uVar11 = (ulong)(uVar30 & 0x7fffffff);
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar21 = uVar11 - 4;
    uVar7 = uVar30 - 2;
    uVar27 = 1;
    do {
      if ((int)((int)uVar11 - (uVar30 - 1)) < (int)uVar30) {
        auVar40 = vpbroadcastq_avx512vl();
        uVar31 = 0;
        lVar8 = 0;
        pauVar14 = (undefined1 (*) [16])(local_d8.super_buffer<unsigned_int>.ptr_ + lVar21);
        uVar23 = 0;
        uVar5 = 0;
        uVar6 = 0;
        lVar12 = 0;
        lVar17 = 0;
        do {
          lVar20 = lVar17;
          uVar22 = uVar34;
          lVar9 = lVar12;
          uVar18 = uVar6;
          uVar10 = uVar5;
          uVar19 = uVar29;
          uVar16 = uVar23;
          lVar28 = lVar8;
          auVar41 = vpbroadcastq_avx512vl();
          auVar41 = vpor_avx2(auVar41,auVar2);
          uVar25 = vpcmpuq_avx512vl(auVar41,auVar40,2);
          uVar24 = uVar25 & 0xf;
          auVar35 = vpmovm2d_avx512vl(uVar24);
          auVar35 = vpshufd_avx(auVar35,0x1b);
          uVar34 = vpmovd2m_avx512vl(auVar35);
          auVar35 = vmovdqu32_avx512vl(*pauVar14);
          auVar38._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar35._4_4_;
          auVar38._0_4_ = (uint)((byte)uVar34 & 1) * auVar35._0_4_;
          auVar38._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar35._8_4_;
          auVar38._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar35._12_4_;
          auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                        (local_d8.super_buffer<unsigned_int>.ptr_ +
                                        (long)(int)uVar27 + uVar31));
          auVar39._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar35._4_4_;
          auVar39._0_4_ = (uint)((byte)uVar24 & 1) * auVar35._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar35._8_4_;
          auVar39._12_4_ = (uint)(byte)(uVar24 >> 3) * auVar35._12_4_;
          auVar35 = vpshufd_avx(auVar38,0x1b);
          auVar41 = vpmovzxdq_avx2(auVar39);
          auVar3 = vpmovzxdq_avx2(auVar35);
          auVar41 = vpmuludq_avx2(auVar3,auVar41);
          uVar15 = vpextrq_avx(auVar41._0_16_,1);
          uVar26 = vpextrq_avx(auVar41._16_16_,1);
          lVar12 = lVar9 + (ulong)CARRY8(uVar26,uVar10);
          uVar23 = auVar41._16_8_ + uVar16;
          lVar17 = lVar20 + (ulong)CARRY8(auVar41._16_8_,uVar16);
          lVar8 = lVar28 + (ulong)CARRY8(uVar15,uVar18);
          uVar34 = auVar41._0_8_ + uVar22;
          uVar29 = uVar19 + CARRY8(auVar41._0_8_,uVar22);
          uVar31 = uVar31 + 4;
          pauVar14 = pauVar14 + -1;
          uVar5 = uVar26 + uVar10;
          uVar6 = uVar15 + uVar18;
        } while (((ulong)uVar7 + 4 & 0xfffffffffffffffc) != uVar31);
        bVar4 = (byte)uVar24 >> 2;
        if ((uVar25 & 1) != 0) {
          uVar22 = uVar34;
          uVar19 = uVar29;
        }
        if ((bVar4 & 1) != 0) {
          lVar20 = lVar17;
          uVar16 = uVar23;
        }
        if ((uVar25 & 2) != 0) {
          uVar18 = uVar15 + uVar18;
          lVar28 = lVar8;
        }
        if ((bVar4 & 2) != 0) {
          lVar9 = lVar12;
          uVar10 = uVar26 + uVar10;
        }
        uVar34 = uVar16 + uVar22 + uVar10 + uVar18;
        uVar29 = lVar20 + uVar19 + (ulong)CARRY8(uVar16,uVar22) +
                 lVar9 + lVar28 + (ulong)CARRY8(uVar10,uVar18) +
                 (ulong)CARRY8(uVar16 + uVar22,uVar10 + uVar18);
      }
      puVar1[uVar11] = (uint)uVar34;
      uVar34 = uVar34 >> 0x20 | uVar29 << 0x20;
      uVar29 = uVar29 >> 0x20;
      uVar11 = uVar11 + 1;
      uVar7 = uVar7 - 1;
      bVar32 = uVar27 != uVar30;
      uVar27 = uVar27 + 1;
    } while (bVar32);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  if (local_d8.super_buffer<unsigned_int>.ptr_ != local_d8.store_) {
    operator_delete(local_d8.super_buffer<unsigned_int>.ptr_,
                    local_d8.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }